

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qalgorithms.h
# Opt level: O0

uint qCountTrailingZeroBits(quint32 v)

{
  undefined4 local_c;
  quint32 v_local;
  
  if (v == 0) {
    local_c = 0x20;
  }
  else {
    local_c = 0;
    for (; (v & 1) == 0; v = v >> 1 | 0x80000000) {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

constexpr inline uint qCountTrailingZeroBits(quint32 v) noexcept
{
#if defined(__cpp_lib_bitops) && __cpp_lib_bitops >= 201907L
    return std::countr_zero(v);
#elif defined(QT_HAS_BUILTIN_CTZ)
    return v ? QAlgorithmsPrivate::qt_builtin_ctz(v) : 32U;
#else
    return QtPrivate::qConstexprCountTrailingZeroBits(v);
#endif
}